

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void call_http_client_handler(connection *conn)

{
  int iVar1;
  connection *conn_local;
  
  if (conn->cl == 0) {
    (conn->mg_conn).content_len = (conn->ns_conn->recv_iobuf).len;
  }
  (conn->mg_conn).content = (conn->ns_conn->recv_iobuf).buf;
  iVar1 = call_user(conn,MG_REPLY);
  if (iVar1 == 0) {
    conn->ns_conn->flags = conn->ns_conn->flags | 0x10;
  }
  iobuf_remove(&conn->ns_conn->recv_iobuf,(conn->mg_conn).content_len);
  (conn->mg_conn).status_code = 0;
  conn->request_len = 0;
  conn->num_bytes_recv = 0;
  conn->cl = 0;
  free(conn->request);
  conn->request = (char *)0x0;
  return;
}

Assistant:

static void call_http_client_handler(struct connection *conn) {
  //conn->mg_conn.status_code = code;
  // For responses without Content-Lengh, use the whole buffer
  if (conn->cl == 0) {
    conn->mg_conn.content_len = conn->ns_conn->recv_iobuf.len;
  }
  conn->mg_conn.content = conn->ns_conn->recv_iobuf.buf;
  if (call_user(conn, MG_REPLY) == MG_FALSE) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
  }
  iobuf_remove(&conn->ns_conn->recv_iobuf, conn->mg_conn.content_len);
  conn->mg_conn.status_code = 0;
  conn->cl = conn->num_bytes_recv = conn->request_len = 0;
  free(conn->request);
  conn->request = NULL;
}